

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entenc.c
# Opt level: O2

void od_ec_encode_bool_q15(od_ec_enc *enc,int val,uint f)

{
  uint rng;
  uint uVar1;
  ulong uVar2;
  
  uVar1 = ((f >> 6) * (uint)(enc->rng >> 8) >> 1) + 4;
  rng = enc->rng - uVar1;
  uVar2 = (ulong)(uint)val;
  if (val != 0) {
    uVar2 = (ulong)rng;
    rng = uVar1;
  }
  od_ec_enc_normalize(enc,uVar2 + enc->low,rng);
  return;
}

Assistant:

void od_ec_encode_bool_q15(od_ec_enc *enc, int val, unsigned f) {
  od_ec_enc_window l;
  unsigned r;
  unsigned v;
  assert(0 < f);
  assert(f < 32768U);
  l = enc->low;
  r = enc->rng;
  assert(32768U <= r);
  v = ((r >> 8) * (uint32_t)(f >> EC_PROB_SHIFT) >> (7 - EC_PROB_SHIFT));
  v += EC_MIN_PROB;
  if (val) l += r - v;
  r = val ? v : r - v;
  od_ec_enc_normalize(enc, l, r);
#if OD_MEASURE_EC_OVERHEAD
  enc->entropy -= OD_LOG2((double)(val ? f : (32768 - f)) / 32768.);
  enc->nb_symbols++;
#endif
}